

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool cmsys::SystemTools::CopyFileIfDifferent(string *source,string *destination)

{
  bool bVar1;
  string local_90;
  undefined1 local_70 [8];
  string source_name;
  undefined1 local_40 [8];
  string new_destination;
  string *destination_local;
  string *source_local;
  
  new_destination.field_2._8_8_ = destination;
  bVar1 = FileIsDirectory(destination);
  if (bVar1) {
    std::__cxx11::string::string((string *)local_40,(string *)new_destination.field_2._8_8_);
    ConvertToUnixSlashes((string *)local_40);
    std::__cxx11::string::operator+=((string *)local_40,'/');
    std::__cxx11::string::string((string *)local_70,(string *)source);
    GetFilenameName(&local_90,(string *)local_70);
    std::__cxx11::string::operator+=((string *)local_40,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    bVar1 = FilesDiffer(source,(string *)local_40);
    if (bVar1) {
      source_local._7_1_ = CopyFileAlways(source,(string *)new_destination.field_2._8_8_);
    }
    else {
      source_local._7_1_ = true;
    }
    std::__cxx11::string::~string((string *)local_70);
    std::__cxx11::string::~string((string *)local_40);
  }
  else {
    bVar1 = FilesDiffer(source,(string *)new_destination.field_2._8_8_);
    if (bVar1) {
      source_local._7_1_ = CopyFileAlways(source,(string *)new_destination.field_2._8_8_);
    }
    else {
      source_local._7_1_ = true;
    }
  }
  return source_local._7_1_;
}

Assistant:

bool SystemTools::CopyFileIfDifferent(const std::string& source,
                                      const std::string& destination)
{
  // special check for a destination that is a directory
  // FilesDiffer does not handle file to directory compare
  if(SystemTools::FileIsDirectory(destination))
    {
    std::string new_destination = destination;
    SystemTools::ConvertToUnixSlashes(new_destination);
    new_destination += '/';
    std::string source_name = source;
    new_destination += SystemTools::GetFilenameName(source_name);
    if(SystemTools::FilesDiffer(source, new_destination))
      {
      return SystemTools::CopyFileAlways(source, destination);
      }
    else
      {
      // the files are the same so the copy is done return
      // true
      return true;
      }
    }
  // source and destination are files so do a copy if they
  // are different
  if(SystemTools::FilesDiffer(source, destination))
    {
    return SystemTools::CopyFileAlways(source, destination);
    }
  // at this point the files must be the same so return true
  return true;
}